

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_estimator_impl.cc
# Opt level: O3

void __thiscall
webrtc::LevelEstimatorImpl::LevelEstimatorImpl(LevelEstimatorImpl *this,CriticalSection *crit)

{
  RMSLevel *this_00;
  ostream *poVar1;
  FatalMessage local_190;
  
  (this->super_LevelEstimator)._vptr_LevelEstimator = (_func_int **)&PTR_Enable_001d1918;
  this->crit_ = crit;
  this->enabled_ = false;
  this_00 = (RMSLevel *)operator_new(0x10);
  RMSLevel::RMSLevel(this_00);
  (this->rms_)._M_t.super___uniq_ptr_impl<webrtc::RMSLevel,_std::default_delete<webrtc::RMSLevel>_>.
  _M_t.super__Tuple_impl<0UL,_webrtc::RMSLevel_*,_std::default_delete<webrtc::RMSLevel>_>.
  super__Head_base<0UL,_webrtc::RMSLevel_*,_false>._M_head_impl = this_00;
  if (crit != (CriticalSection *)0x0) {
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/level_estimator_impl.cc"
             ,0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"Check failed: crit",0x12);
  std::ios::widen((char)(ostream *)&local_190 + (char)*(undefined8 *)(local_190._0_8_ + -0x18));
  std::ostream::put((char)&local_190);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# ",2);
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

LevelEstimatorImpl::LevelEstimatorImpl(rtc::CriticalSection* crit)
    : crit_(crit), rms_(new RMSLevel()) {
  RTC_DCHECK(crit);
}